

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.cpp
# Opt level: O0

RPCHelpMan * wallet::listwallets(void)

{
  initializer_list<RPCResult> __l;
  RPCHelpMan *in_RDI;
  undefined1 *puVar1;
  long in_FS_OFFSET;
  allocator<RPCResult> *in_stack_fffffffffffffb78;
  RPCResult *pRVar2;
  anon_class_1_0_00000001 *in_stack_fffffffffffffb80;
  function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)> *in_stack_fffffffffffffb88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffba8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffbb0;
  allocator<char> *in_stack_fffffffffffffbb8;
  undefined1 *puVar3;
  iterator in_stack_fffffffffffffbc0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffbc8;
  undefined8 in_stack_fffffffffffffbd8;
  undefined1 skip_type_check;
  vector<RPCResult,_std::allocator<RPCResult>_> *in_stack_fffffffffffffbe0;
  string *in_stack_fffffffffffffbe8;
  string *in_stack_fffffffffffffbf0;
  RPCResult *result;
  RPCResults *this;
  allocator<char> local_35d;
  allocator<char> local_35c;
  allocator<char> local_35b;
  allocator<char> local_35a [2];
  RPCResults local_358;
  RPCExamples *in_stack_fffffffffffffcc0;
  _Alloc_hider in_stack_fffffffffffffcc8;
  vector<RPCArg,_std::allocator<RPCArg>_> *in_stack_fffffffffffffcd0;
  undefined8 in_stack_fffffffffffffcd8;
  undefined8 in_stack_fffffffffffffce0;
  undefined8 in_stack_fffffffffffffce8;
  allocator<char> local_2da;
  allocator<char> local_2d9 [185];
  RPCMethodImpl *in_stack_fffffffffffffde0;
  undefined1 local_198 [136];
  undefined1 local_110 [264];
  long local_8;
  
  skip_type_check = (undefined1)((ulong)in_stack_fffffffffffffbd8 >> 0x38);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffbc8,(char *)in_stack_fffffffffffffbc0,in_stack_fffffffffffffbb8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffbc8,(char *)in_stack_fffffffffffffbc0,in_stack_fffffffffffffbb8);
  std::vector<RPCArg,_std::allocator<RPCArg>_>::vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_fffffffffffffb78);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffbc8,(char *)in_stack_fffffffffffffbc0,in_stack_fffffffffffffbb8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffbc8,(char *)in_stack_fffffffffffffbc0,in_stack_fffffffffffffbb8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffbc8,(char *)in_stack_fffffffffffffbc0,in_stack_fffffffffffffbb8);
  pRVar2 = (RPCResult *)&stack0xfffffffffffffcce;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffbc8,(char *)in_stack_fffffffffffffbc0,in_stack_fffffffffffffbb8);
  local_358.m_results.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_358.m_results.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_358.m_results.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this = &local_358;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffffb78);
  RPCResult::RPCResult
            (pRVar2,(Type)((ulong)this >> 0x20),in_stack_fffffffffffffbf0,in_stack_fffffffffffffbe8,
             in_stack_fffffffffffffbe0,(bool)skip_type_check);
  result = (RPCResult *)(local_35a + 1);
  std::allocator<RPCResult>::allocator(in_stack_fffffffffffffb78);
  __l._M_len = (size_type)in_stack_fffffffffffffbc8;
  __l._M_array = in_stack_fffffffffffffbc0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffffbb8,__l,
             (allocator_type *)in_stack_fffffffffffffbb0);
  RPCResult::RPCResult
            (pRVar2,(Type)((ulong)this >> 0x20),(string *)result,in_stack_fffffffffffffbe8,
             in_stack_fffffffffffffbe0,(bool)skip_type_check);
  RPCResults::RPCResults(this,result);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffbc8,(char *)in_stack_fffffffffffffbc0,in_stack_fffffffffffffbb8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffbc8,(char *)in_stack_fffffffffffffbc0,in_stack_fffffffffffffbb8);
  HelpExampleCli(in_stack_fffffffffffffbb0,in_stack_fffffffffffffba8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffbc8,(char *)in_stack_fffffffffffffbc0,in_stack_fffffffffffffbb8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffbc8,(char *)in_stack_fffffffffffffbc0,in_stack_fffffffffffffbb8);
  HelpExampleRpc(in_stack_fffffffffffffbb0,in_stack_fffffffffffffba8);
  std::operator+(in_stack_fffffffffffffbb0,in_stack_fffffffffffffba8);
  RPCExamples::RPCExamples((RPCExamples *)in_stack_fffffffffffffb78,(string *)0x163c996);
  pRVar2 = (RPCResult *)&stack0xfffffffffffffc80;
  std::function<UniValue(RPCHelpMan_const&,JSONRPCRequest_const&)>::
  function<wallet::listwallets()::__0,void>(in_stack_fffffffffffffb88,in_stack_fffffffffffffb80);
  RPCHelpMan::RPCHelpMan
            ((RPCHelpMan *)in_stack_fffffffffffffce8,(string *)in_stack_fffffffffffffce0,
             (string *)in_stack_fffffffffffffcd8,in_stack_fffffffffffffcd0,
             (RPCResults *)in_stack_fffffffffffffcc8._M_p,in_stack_fffffffffffffcc0,
             in_stack_fffffffffffffde0);
  std::function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)>::~function
            ((function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)> *)pRVar2);
  RPCExamples::~RPCExamples((RPCExamples *)pRVar2);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pRVar2);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pRVar2);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pRVar2);
  std::allocator<char>::~allocator(&local_35d);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pRVar2);
  std::allocator<char>::~allocator(&local_35c);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pRVar2);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pRVar2);
  std::allocator<char>::~allocator(&local_35b);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pRVar2);
  std::allocator<char>::~allocator(local_35a);
  RPCResults::~RPCResults((RPCResults *)pRVar2);
  RPCResult::~RPCResult(pRVar2);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffffb88);
  std::allocator<RPCResult>::~allocator((allocator<RPCResult> *)pRVar2);
  puVar3 = local_198;
  puVar1 = local_110;
  do {
    puVar1 = puVar1 + -0x88;
    RPCResult::~RPCResult(pRVar2);
  } while (puVar1 != puVar3);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffffb88);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pRVar2);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffcce);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pRVar2);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffccf);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pRVar2);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffcee);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pRVar2);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffcef);
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_fffffffffffffb88);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pRVar2);
  std::allocator<char>::~allocator(&local_2da);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pRVar2);
  std::allocator<char>::~allocator(local_2d9);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

static RPCHelpMan listwallets()
{
    return RPCHelpMan{"listwallets",
                "Returns a list of currently loaded wallets.\n"
                "For full information on the wallet, use \"getwalletinfo\"\n",
                {},
                RPCResult{
                    RPCResult::Type::ARR, "", "",
                    {
                        {RPCResult::Type::STR, "walletname", "the wallet name"},
                    }
                },
                RPCExamples{
                    HelpExampleCli("listwallets", "")
            + HelpExampleRpc("listwallets", "")
                },
        [&](const RPCHelpMan& self, const JSONRPCRequest& request) -> UniValue
{
    UniValue obj(UniValue::VARR);

    WalletContext& context = EnsureWalletContext(request.context);
    for (const std::shared_ptr<CWallet>& wallet : GetWallets(context)) {
        LOCK(wallet->cs_wallet);
        obj.push_back(wallet->GetName());
    }

    return obj;
},
    };
}